

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O1

void __thiscall clask::server_t::_run(server_t *this,string *host,int port)

{
  int __fd;
  int iVar1;
  runtime_error *this_00;
  hostent *phVar2;
  char *__s;
  int addrlen;
  sockaddr_in address;
  sockopt_t opt;
  thread t;
  allocator<char> local_91;
  socklen_t local_90;
  int local_8c;
  undefined1 local_88 [8];
  char acStack_80 [20];
  undefined4 local_6c;
  thread local_68;
  server_t *local_60;
  type local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_88 = (undefined1  [8])0x0;
  acStack_80[0] = '\0';
  acStack_80[1] = '\0';
  acStack_80[2] = '\0';
  acStack_80[3] = '\0';
  acStack_80[4] = '\0';
  acStack_80[5] = '\0';
  acStack_80[6] = '\0';
  acStack_80[7] = '\0';
  local_6c = 1;
  local_90 = 0x10;
  sort_handlers(&this->treeGET);
  local_60 = this;
  sort_handlers(&this->treePOST);
  __fd = socket(2,1,0);
  if (__fd < 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"socket failed");
  }
  else {
    iVar1 = setsockopt(__fd,1,2,&local_6c,4);
    if (iVar1 == 0) {
      local_88._0_2_ = 2;
      if (host->_M_string_length == 0) {
        local_88 = (undefined1  [8])((ulong)local_88 & 0xffffffff);
      }
      else {
        phVar2 = gethostbyname((host->_M_dataplus)._M_p);
        if (phVar2 == (hostent *)0x0) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"gethostbyname");
          goto LAB_0011cc0b;
        }
        local_88._4_4_ = *(undefined4 *)*phVar2->h_addr_list;
      }
      local_88._2_2_ = (ushort)port << 8 | (ushort)port >> 8;
      iVar1 = bind(__fd,(sockaddr *)local_88,0x10);
      if (iVar1 < 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"bind failed");
      }
      else {
        iVar1 = listen(__fd,0x1000);
        if (iVar1 < 0) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"listen");
        }
        else {
          local_8c = accept(__fd,(sockaddr *)local_88,&local_90);
          if (-1 < local_8c) {
            do {
              local_58.this = local_60;
              __s = inet_ntoa((in_addr)local_88._4_4_);
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_91);
              std::thread::
              thread<clask::server_t::_run(std::__cxx11::string_const&,int)::_lambda(int,std::__cxx11::string_const&)_1_,int&,std::__cxx11::string,void>
                        (&local_68,&local_58,&local_8c,&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              std::thread::detach();
              if (local_68._M_id._M_thread != 0) {
                std::terminate();
              }
              local_8c = accept(__fd,(sockaddr *)local_88,&local_90);
            } while (-1 < local_8c);
          }
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"accept");
        }
      }
    }
    else {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"setsockopt");
    }
  }
LAB_0011cc0b:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void server_t::_run(const std::string& host, int port = 8080) {
  int server_fd, s;
  struct sockaddr_in address{};
  sockopt_t opt = 1;
  int addrlen = sizeof(address);

#ifdef _WIN32
  WSADATA wsa;
  (void) WSAStartup(MAKEWORD(2, 0), &wsa);
#endif

  sort_handlers(treeGET);
  sort_handlers(treePOST);

#if 0
  for (auto v : treeGET.children) {
    std::cout << v.name << std::endl;
    std::cout << v.placeholder << std::endl;
  }
#endif

  if ((server_fd = (int) socket(AF_INET, SOCK_STREAM, 0)) < 0) {
    throw std::runtime_error("socket failed");
  }

  if (setsockopt(server_fd, SOL_SOCKET, SO_REUSEADDR, &opt, (int) sizeof(opt))) {
    throw std::runtime_error("setsockopt");
  }
  address.sin_family = AF_INET;
  if (host.empty())
    address.sin_addr.s_addr = htonl(INADDR_ANY);
  else {
    auto info = gethostbyname(host.c_str());
    if (info == nullptr) {
      throw std::runtime_error("gethostbyname");
    }
    address.sin_addr = *(struct in_addr *)(info->h_addr_list[0]);
  }
  address.sin_port = htons((u_short) port);

  if (bind(server_fd, (struct sockaddr *)&address, sizeof(address)) < 0) {
    throw std::runtime_error("bind failed");
  }
  if (listen(server_fd, SOMAXCONN) < 0) {
    throw std::runtime_error("listen");
  }

  while (true) {
    if ((s = (int) accept(server_fd, (struct sockaddr *)&address, (socklen_t*)&addrlen))<0) {
      throw std::runtime_error("accept");
    }

    std::thread t([&](int s, const std::string& remote) {
retry:
      char buf[4096];
      const char *method, *path;
      int pret, minor_version;
      struct phr_header headers[100];
      size_t buflen = 0, prevbuflen = 0, method_len, path_len, num_headers;
      ssize_t rret;

      while (true) {
        while ((rret = recv(s, buf + buflen, (int) (sizeof(buf) - buflen), MSG_NOSIGNAL)) == -1 && errno == EINTR);
        if (rret <= 0) {
          // IOError
          closesocket(s);
          return;
        }

        prevbuflen = buflen;
        buflen += rret;
        num_headers = sizeof(headers) / sizeof(headers[0]);
        pret = phr_parse_request(
            buf, buflen, &method, &method_len, &path, &path_len,
            &minor_version, headers, &num_headers, prevbuflen);
        if (pret > 0) {
          break;
        }
        if (pret == -1) {
          // ParseError
#ifndef CLASK_DISABLE_LOGS
          logger().get(log_level::ERR) << "invalid request";
#endif
          return;
        }
        if (buflen == sizeof(buf)) {
          // RequestIsTooLongError
#ifndef CLASK_DISABLE_LOGS
          logger().get(log_level::ERR) << "request is too long";
#endif
          continue;
        }
      }

      const std::string req_method(method, method_len);
      std::string req_path(path, path_len);
      std::string req_body(buf + pret, buflen - pret);
      const std::string req_raw_path = req_path;
      std::unordered_map<std::string, std::string> req_uri_params;
      std::vector<header> req_headers;

      auto pos = req_path.find('?');
      if (pos != std::string::npos) {
        req_path.resize(pos);
        std::istringstream iss(req_raw_path.substr(pos + 1));
        std::string keyval, key, val;
        while (std::getline(iss, keyval, '&')) {
          std::istringstream isk(keyval);
          if(std::getline(std::getline(isk, key, '='), val)) {
            req_uri_params[url_decode(key)] = url_decode(val);
          }
        }
      }

      bool keep_alive = minor_version == 1;
      bool has_content_length = false;
      size_t content_length = 0;
      for (size_t n = 0; n < num_headers; n++) {
        auto key = std::string(headers[n].name, headers[n].name_len);
        auto val = std::string(headers[n].value, headers[n].value_len);
        camelize(key);
        if (key == "Content-Length") {
          content_length = std::stoi(val);
          has_content_length = true;
        } else if (key == "Connection") {
          for (auto& c : val) c = (char) std::tolower(c);
          if (val == "keep-alive")
            keep_alive = true;
          else if (val == "close")
            keep_alive = false;
        }
        req_headers.emplace_back(std::move(key), std::move(val));
      }

      if (has_content_length && buflen - pret < content_length) {
        auto rest = content_length - (buflen - pret);
        buflen = 0;
        while (rest > 0) {
          while ((rret = recv(s, buf + buflen, (int) (sizeof(buf) - buflen), MSG_NOSIGNAL)) == -1 && errno == EINTR);
          if (rret <= 0) {
            // IOError
            closesocket(s);
            return;
          }
          req_body.append(buf, rret);
          rest -= rret;
        }
      }

      request req(
          req_method,
          req_raw_path,
          req_path,
          std::move(req_uri_params),
          std::move(req_headers),
          std::move(req_body));

      if (!match(req_method, req_path, [&](const func_t& fn, const std::vector<std::string>& args) {
        req.args = args;
        int code = 500;
        try {
          code = fn.handle(s, req, keep_alive);
#ifndef CLASK_DISABLE_LOGS
          logger().get(log_level::INFO) << remote << " " << code << " " << req_method << " " << req_path;
#endif
        } catch (std::exception&) {
#ifndef CLASK_DISABLE_LOGS
          logger().get(log_level::WARN) << remote << " " << code << " " << req_method << " " << req_path;
#endif
          std::ostringstream os;
          os << "HTTP/1.0 " << code << " Internal Server Error\r\nContent-Type: text/plain\r\n\r\nInternal Server Error";
          send(s, os.str().data(), (int) os.str().size(), MSG_NOSIGNAL);
        }
      })) {
#ifndef CLASK_DISABLE_LOGS
        logger().get(log_level::WARN) << remote << " " << 404 << " " << req_method << " " << req_path;
#endif
        static const std::string res_content = "HTTP/1.0 404 Not Found\r\nContent-Type: text/plain\r\n\r\nNot Found";
        send(s, res_content.data(), (int) res_content.size(), MSG_NOSIGNAL);
      }

      if (keep_alive)
        goto retry;
      closesocket(s);
    }, s, (std::string) inet_ntoa(address.sin_addr));
    t.detach();
  }
}